

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void renumber_script_commands(Am_Value_List *orig_cmds)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_20;
  Am_Object this_cmd;
  int i;
  Am_Value_List *orig_cmds_local;
  
  this_cmd.data._4_4_ = 1;
  Am_Object::Am_Object(&local_20);
  Am_Value_List::Start(orig_cmds);
  while( true ) {
    bVar1 = Am_Value_List::Last(orig_cmds);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_value = Am_Value_List::Get(orig_cmds);
    Am_Object::operator=(&local_20,in_value);
    Am_Object::Set(&local_20,Am_COMMAND_INDEX_IN_SCRIPT,this_cmd.data._4_4_,1);
    Am_Value_List::Next(orig_cmds);
    this_cmd.data._4_4_ = this_cmd.data._4_4_ + 1;
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
renumber_script_commands(Am_Value_List &orig_cmds)
{
  int i = 1;
  Am_Object this_cmd;
  for (orig_cmds.Start(); !orig_cmds.Last(); orig_cmds.Next(), i++) {
    this_cmd = orig_cmds.Get();
    this_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, i, Am_OK_IF_NOT_THERE);
  }
}